

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void ParseLine(bool parselabels)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *srcNonWhiteChar;
  
  iVar3 = PrepareLine();
  if (iVar3 == 0) {
    if (eolComment != (char *)0x0) {
      bVar1 = IsSldExportActive();
      if (bVar1) {
        SldTrackComments();
      }
    }
    if (*lp != '\0') {
      if (parselabels) {
        ParseLabel();
      }
      iVar3 = SkipBlanks();
      if (iVar3 == 0) {
        ParseMacro();
      }
      iVar3 = SkipBlanks();
      if (iVar3 == 0) {
        ParseInstruction();
      }
      iVar3 = SkipBlanks();
      if (iVar3 == 0) {
        Error("Unexpected",lp,PASS3);
      }
      ListFile(false);
      return;
    }
    srcNonWhiteChar = line;
    SkipBlanks(&srcNonWhiteChar);
    cVar2 = *srcNonWhiteChar;
    if ((cVar2 == ';') || ((cVar2 == '/' && (cVar2 = '/', srcNonWhiteChar[1] == '/')))) {
      srcNonWhiteChar = lp;
      cVar2 = *lp;
    }
    ListFile(comlin != 0 || cVar2 != '\0');
  }
  return;
}

Assistant:

void ParseLine(bool parselabels) {
	if (PrepareLine()) return;

	if (eolComment && IsSldExportActive()) SldTrackComments();

	if (!*lp) {
		char *srcNonWhiteChar = line;
		SkipBlanks(srcNonWhiteChar);
		// check if only "end-line" comment remained, treat that one as "empty" line too
		if (';' == srcNonWhiteChar[0] || ('/' == srcNonWhiteChar[0] && '/' == srcNonWhiteChar[1]))
			srcNonWhiteChar = lp;			// force srcNonWhiteChar to point to 0
		if (*srcNonWhiteChar || comlin) {	// non-empty source line turned into nothing
			ListFile(true);					// or empty source inside comment-block -> "skipped"
		} else {
			ListFile();						// empty source line outside of block-comment -> "normal"
		}
		return;
	}

	if (parselabels) ParseLabel();
	if (!SkipBlanks()) ParseMacro();
	if (!SkipBlanks()) ParseInstruction();
	if (!SkipBlanks()) Error("Unexpected", lp);
	ListFile();
}